

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall
el::base::LogFormat::updateDateFormat(LogFormat *this,size_t index,string_t *currFormat)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  allocator local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  uVar4 = index + 9;
  if ((this->m_flags & 2) == 0) {
    uVar4 = index;
  }
  if ((uVar4 < currFormat->_M_string_length) &&
     (pcVar3 = (currFormat->_M_dataplus)._M_p + uVar4, *pcVar3 == '{')) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    for (lVar2 = 1; (cVar1 = pcVar3[lVar2], cVar1 != '\0' && (cVar1 != '}')); lVar2 = lVar2 + 1) {
      std::operator<<(local_1a8,cVar1);
    }
    std::__cxx11::string::erase((ulong)currFormat,uVar4);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->m_dateTimeFormat,(string *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else if ((this->m_flags & 2) != 0) {
    std::__cxx11::string::string((string *)&ss,"%Y-%M-%d %H:%m:%s,%g",local_1d8);
    std::__cxx11::string::operator=((string *)&this->m_dateTimeFormat,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
  }
  return;
}

Assistant:

void LogFormat::updateDateFormat(std::size_t index, base::type::string_t& currFormat) {
  if (hasFlag(base::FormatFlags::DateTime)) {
    index += ELPP_STRLEN(base::consts::kDateTimeFormatSpecifier);
  }
  const base::type::char_t* ptr = currFormat.c_str() + index;
  if ((currFormat.size() > index) && (ptr[0] == '{')) {
    // User has provided format for date/time
    ++ptr;
    int count = 1;  // Start by 1 in order to remove starting brace
    std::stringstream ss;
    for (; *ptr; ++ptr, ++count) {
      if (*ptr == '}') {
        ++count;  // In order to remove ending brace
        break;
      }
      ss << static_cast<char>(*ptr);
    }
    currFormat.erase(index, count);
    m_dateTimeFormat = ss.str();
  } else {
    // No format provided, use default
    if (hasFlag(base::FormatFlags::DateTime)) {
      m_dateTimeFormat = std::string(base::consts::kDefaultDateTimeFormat);
    }
  }
}